

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O2

uint32_t anon_unknown.dwarf_2b1957::getValue
                   (UCPTrieData data,UCPTrieValueWidth valueWidth,int32_t dataIndex)

{
  if (valueWidth == UCPTRIE_VALUE_BITS_8) {
    return (uint32_t)*(byte *)((long)data.ptr0 + (long)dataIndex);
  }
  if (valueWidth != UCPTRIE_VALUE_BITS_32) {
    if (valueWidth == UCPTRIE_VALUE_BITS_16) {
      return (uint32_t)*(ushort *)((long)data.ptr0 + (long)dataIndex * 2);
    }
    return 0xffffffff;
  }
  return *(data.ptr32 + (long)dataIndex * 4);
}

Assistant:

inline uint32_t getValue(UCPTrieData data, UCPTrieValueWidth valueWidth, int32_t dataIndex) {
    switch (valueWidth) {
    case UCPTRIE_VALUE_BITS_16:
        return data.ptr16[dataIndex];
    case UCPTRIE_VALUE_BITS_32:
        return data.ptr32[dataIndex];
    case UCPTRIE_VALUE_BITS_8:
        return data.ptr8[dataIndex];
    default:
        // Unreachable if the trie is properly initialized.
        return 0xffffffff;
    }
}